

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O3

void __thiscall spvtools::opt::MergeReturnPass::AddNewPhiNodes(MergeReturnPass *this)

{
  IRContext *this_00;
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _Node_conflict *__tmp;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> order;
  _List_node_base local_30;
  undefined8 local_20;
  
  local_20 = 0;
  this_00 = (this->super_MemPass).super_Pass.context_;
  local_30._M_next = &local_30;
  local_30._M_prev = &local_30;
  if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(this_00);
  }
  CFG::ComputeStructuredOrder
            ((this_00->cfg_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
             _M_t.
             super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
             super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,this->function_,
             (BasicBlock *)
             (((this->function_->blocks_).
               super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t,(list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    *)&local_30);
  for (p_Var1 = local_30._M_next; p_Var2 = local_30._M_next, p_Var1 != &local_30;
      p_Var1 = (((_List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    AddNewPhiNodes(this,(BasicBlock *)p_Var1[1]._M_next);
  }
  while (p_Var2 != &local_30) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var1;
  }
  return;
}

Assistant:

void MergeReturnPass::AddNewPhiNodes() {
  std::list<BasicBlock*> order;
  cfg()->ComputeStructuredOrder(function_, &*function_->begin(), &order);

  for (BasicBlock* bb : order) {
    AddNewPhiNodes(bb);
  }
}